

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool IsMemoryStoreToVariable(VmInstruction *instruction,VariableData *variable)

{
  VmInstructionType VVar1;
  VmValue **ppVVar2;
  VmValue *pVVar3;
  bool bVar4;
  
  VVar1 = instruction->cmd;
  if (VVar1 - VM_INST_STORE_BYTE < 7) {
    ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,0);
    pVVar3 = *ppVVar2;
    if ((pVVar3 == (VmValue *)0x0) || (pVVar3->typeID != 1)) {
      VVar1 = instruction->cmd;
      goto LAB_001a3c24;
    }
LAB_001a3c4a:
    bVar4 = (VariableData *)pVVar3[1].comment.end == variable;
  }
  else {
LAB_001a3c24:
    if (VVar1 == VM_INST_MEM_COPY) {
      ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,0);
      pVVar3 = *ppVVar2;
      if (pVVar3 == (VmValue *)0x0) {
        return false;
      }
      if (pVVar3->typeID == 1) goto LAB_001a3c4a;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool IsMemoryStoreToVariable(VmInstruction *instruction, VariableData *variable)
{
	if(instruction->cmd >= VM_INST_STORE_BYTE && instruction->cmd <= VM_INST_STORE_STRUCT)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	if(instruction->cmd == VM_INST_MEM_COPY)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	return false;
}